

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O3

void __thiscall
glcts::ProgramUniformCase::progUniformi
          (ProgramUniformCase *this,Functions *gl,GLuint prog,int arraySize,int *location,int *value
          )

{
  GLint *pGVar1;
  
  (*gl->programUniform1i)(prog,*location,*value);
  (*gl->programUniform2i)(prog,location[1],value[1],value[2]);
  (*gl->programUniform3i)(prog,location[2],value[3],value[4],value[5]);
  (*gl->programUniform4i)(prog,location[3],value[6],value[7],value[8],value[9]);
  (*gl->programUniform1iv)(prog,location[4],arraySize,value + 10);
  pGVar1 = value + (long)arraySize + 10;
  (*gl->programUniform2iv)(prog,location[6],arraySize,pGVar1);
  (*gl->programUniform3iv)(prog,location[8],arraySize,pGVar1 + arraySize * 2);
  (*gl->programUniform4iv)(prog,location[10],arraySize,pGVar1 + arraySize * 2 + arraySize * 3);
  return;
}

Assistant:

void progUniformi(const glw::Functions& gl, glw::GLuint prog, int arraySize, int* location, int* value)
	{
		gl.programUniform1i(prog, location[0], value[0]);
		value += 1;
		gl.programUniform2i(prog, location[1], value[0], value[1]);
		value += 2;
		gl.programUniform3i(prog, location[2], value[0], value[1], value[2]);
		value += 3;
		gl.programUniform4i(prog, location[3], value[0], value[1], value[2], value[3]);
		value += 4;

		gl.programUniform1iv(prog, location[4], arraySize, value);
		value += 1 * arraySize;
		gl.programUniform2iv(prog, location[6], arraySize, value);
		value += 2 * arraySize;
		gl.programUniform3iv(prog, location[8], arraySize, value);
		value += 3 * arraySize;
		gl.programUniform4iv(prog, location[10], arraySize, value);
	}